

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O2

void __thiscall
myvk::Buffer::
UpdateData<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          (Buffer *this,
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          begin,__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                end,uint32_t byte_offset)

{
  void *pvVar1;
  
  if (this->m_mapped_ptr == (void *)0x0) {
    pvVar1 = Map(this);
    if ((long)end._M_current - (long)begin._M_current != 0) {
      memmove((void *)((long)pvVar1 + (ulong)byte_offset),begin._M_current,
              (long)end._M_current - (long)begin._M_current);
    }
    Unmap(this);
    return;
  }
  if ((long)end._M_current - (long)begin._M_current != 0) {
    memmove((void *)((long)this->m_mapped_ptr + (ulong)byte_offset),begin._M_current,
            (long)end._M_current - (long)begin._M_current);
    return;
  }
  return;
}

Assistant:

inline void UpdateData(Iter begin, Iter end, uint32_t byte_offset = 0) const {
		using T = typename std::iterator_traits<Iter>::value_type;
		if (m_mapped_ptr) {
			std::copy(begin, end, (T *)((uint8_t *)GetMappedData() + byte_offset));
		} else {
			std::copy(begin, end, (T *)((uint8_t *)Map() + byte_offset));
			Unmap();
		}
	}